

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O0

void __thiscall Test_aistr_length_Test::TestBody(Test_aistr_length_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_138;
  Message local_130;
  int local_124;
  size_t local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_4;
  Message local_100;
  int local_f4;
  size_t local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_3;
  Message local_d0;
  int local_c4;
  size_t local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  Message local_a0;
  int local_94;
  size_t local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70;
  int local_64;
  size_t local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  Message local_40 [2];
  invalid_argument *anon_var_0;
  byte local_19;
  char *pcStack_18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Test_aistr_length_Test *this_local;
  
  gtest_msg.value = (char *)this;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    local_19 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      ai::length((char *)0x0,10);
    }
    if ((local_19 & 1) != 0) goto LAB_001176e6;
    pcStack_18 = 
    "Expected: ai::length(nullptr, 10) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_40);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x22,pcStack_18);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_40);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
  testing::Message::~Message(local_40);
LAB_001176e6:
  local_60 = ai::length("",10);
  local_64 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_58,"ai::length(\"\", 10)","0",&local_60,&local_64);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_70);
  }
  anon_var_0._0_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  if ((uint)anon_var_0 == 0) {
    local_90 = ai::length("1234",10);
    local_94 = 4;
    testing::internal::EqHelper<false>::Compare<unsigned_long,int>
              ((EqHelper<false> *)local_88,"ai::length(\"1234\", 10)","4",&local_90,&local_94);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x24,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_a0);
    }
    anon_var_0._0_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if ((uint)anon_var_0 == 0) {
      local_c0 = ai::length("123456789",9);
      local_c4 = 9;
      testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                ((EqHelper<false> *)local_b8,"ai::length(\"123456789\", 9)","9",&local_c0,&local_c4)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar1) {
        testing::Message::Message(&local_d0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x25,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_d0);
      }
      anon_var_0._0_4_ = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
      if ((uint)anon_var_0 == 0) {
        local_f0 = ai::length("1234567890",10);
        local_f4 = 10;
        testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                  ((EqHelper<false> *)local_e8,"ai::length(\"1234567890\", 10)","10",&local_f0,
                   &local_f4);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
        if (!bVar1) {
          testing::Message::Message(&local_100);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                     ,0x26,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_100);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_100);
        }
        anon_var_0._0_4_ = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
        if ((uint)anon_var_0 == 0) {
          local_120 = ai::length("12345678901",10);
          local_124 = 10;
          testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                    ((EqHelper<false> *)local_118,"ai::length(\"12345678901\", 10)","10",&local_120,
                     &local_124);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
          if (!bVar1) {
            testing::Message::Message(&local_130);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
            testing::internal::AssertHelper::AssertHelper
                      (&local_138,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                       ,0x27,pcVar2);
            testing::internal::AssertHelper::operator=(&local_138,&local_130);
            testing::internal::AssertHelper::~AssertHelper(&local_138);
            testing::Message::~Message(&local_130);
          }
          anon_var_0._0_4_ = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(Test_aistr, length) {
    EXPECT_THROW(ai::length(nullptr, 10), std::invalid_argument);
    ASSERT_EQ(ai::length("", 10), 0);
    ASSERT_EQ(ai::length("1234", 10), 4);
    ASSERT_EQ(ai::length("123456789", 9), 9);
    ASSERT_EQ(ai::length("1234567890", 10), 10);
    ASSERT_EQ(ai::length("12345678901", 10), 10);
}